

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathway.c
# Opt level: O3

void read_pathway(pathway_t *record,int field_count,char **field_names,char **field_values)

{
  char cVar1;
  double dVar2;
  int iVar3;
  pathway_mode_t pVar4;
  long lVar5;
  pathway_directions_t pVar6;
  ulong uVar7;
  char *pcVar8;
  pathway_t *__dest;
  
  record->id[0] = '\0';
  record->from_stop_id[0] = '\0';
  record->to_stop_id[0] = '\0';
  record->mode = PTMD_NOT_SET;
  record->is_bidirectional = PD_NOT_SET;
  record->reversed_signposted_as[0] = '\0';
  record->length = 0.0;
  record->traversal_time = 0;
  record->stair_count = 0;
  record->max_slope = 0.0;
  record->min_width = 0.0;
  record->signposted_as[0] = '\0';
  if (0 < field_count) {
    uVar7 = 0;
    do {
      pcVar8 = field_names[uVar7];
      iVar3 = strcmp(pcVar8,"pathway_id");
      if (iVar3 == 0) {
        pcVar8 = field_values[uVar7];
        __dest = record;
LAB_001063c8:
        strcpy(__dest->id,pcVar8);
      }
      else {
        iVar3 = strcmp(pcVar8,"from_stop_id");
        if (iVar3 == 0) {
          pcVar8 = field_values[uVar7];
          __dest = (pathway_t *)record->from_stop_id;
          goto LAB_001063c8;
        }
        iVar3 = strcmp(pcVar8,"to_stop_id");
        if (iVar3 == 0) {
          pcVar8 = field_values[uVar7];
          __dest = (pathway_t *)record->to_stop_id;
          goto LAB_001063c8;
        }
        iVar3 = strcmp(pcVar8,"pathway_mode");
        if (iVar3 == 0) {
          pVar4 = parse_pathway_mode(field_values[uVar7]);
          record->mode = pVar4;
        }
        else {
          iVar3 = strcmp(pcVar8,"is_bidirectional");
          if (iVar3 == 0) {
            cVar1 = *field_values[uVar7];
            if (cVar1 == '0') {
              pVar6 = PD_UNIDIRECTIONAL;
LAB_0010643b:
              if (field_values[uVar7][1] != '\0') {
                pVar6 = PD_NOT_SET;
              }
            }
            else {
              pVar6 = PD_NOT_SET;
              if (cVar1 == '1') {
                pVar6 = PD_BIDIRECTIONAL;
                goto LAB_0010643b;
              }
            }
            record->is_bidirectional = pVar6;
          }
          else {
            iVar3 = strcmp(pcVar8,"length");
            if (iVar3 == 0) {
              dVar2 = strtod(field_values[uVar7],(char **)0x0);
              record->length = dVar2;
            }
            else {
              iVar3 = strcmp(pcVar8,"traversal_time");
              if (iVar3 == 0) {
                lVar5 = strtol(field_values[uVar7],(char **)0x0,0);
                record->traversal_time = (int)lVar5;
              }
              else {
                iVar3 = strcmp(pcVar8,"stair_count");
                if (iVar3 == 0) {
                  lVar5 = strtol(field_values[uVar7],(char **)0x0,0);
                  record->stair_count = (int)lVar5;
                }
                else {
                  iVar3 = strcmp(pcVar8,"max_slope");
                  if (iVar3 == 0) {
                    dVar2 = strtod(field_values[uVar7],(char **)0x0);
                    record->max_slope = dVar2;
                  }
                  else {
                    iVar3 = strcmp(pcVar8,"min_width");
                    if (iVar3 != 0) {
                      iVar3 = strcmp(pcVar8,"signposted_as");
                      if (iVar3 == 0) {
                        pcVar8 = field_values[uVar7];
                        __dest = (pathway_t *)record->signposted_as;
                      }
                      else {
                        iVar3 = strcmp(pcVar8,"reversed_signposted_as");
                        if (iVar3 != 0) goto LAB_001063cd;
                        pcVar8 = field_values[uVar7];
                        __dest = (pathway_t *)record->reversed_signposted_as;
                      }
                      goto LAB_001063c8;
                    }
                    dVar2 = strtod(field_values[uVar7],(char **)0x0);
                    record->min_width = dVar2;
                  }
                }
              }
            }
          }
        }
      }
LAB_001063cd:
      uVar7 = uVar7 + 1;
    } while ((uint)field_count != uVar7);
  }
  return;
}

Assistant:

void read_pathway(pathway_t *record, int field_count, const char **field_names, const char **field_values) {
    init_pathway(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "pathway_id") == 0) {
            strcpy(record->id, field_values[i]);
            continue;
        }

        if (strcmp(field_names[i], "from_stop_id") == 0) {
            strcpy(record->from_stop_id, field_values[i]);
            continue;
        }

        if (strcmp(field_names[i], "to_stop_id") == 0) {
            strcpy(record->to_stop_id, field_values[i]);
            continue;
        }

        if (strcmp(field_names[i], "pathway_mode") == 0) {
            record->mode = parse_pathway_mode(field_values[i]);
            continue;
        }

        if (strcmp(field_names[i], "is_bidirectional") == 0) {
            record->is_bidirectional = parse_pathway_directions(field_values[i]);
            continue;
        }

        if (strcmp(field_names[i], "length") == 0) {
            record->length = strtod(field_values[i], NULL);
            continue;
        }

        if (strcmp(field_names[i], "traversal_time") == 0) {
            record->traversal_time = (int)strtol(field_values[i], NULL, 0);
            continue;
        }

        if (strcmp(field_names[i], "stair_count") == 0) {
            record->stair_count = (int)strtol(field_values[i], NULL, 0);
            continue;
        }

        if (strcmp(field_names[i], "max_slope") == 0) {
            record->max_slope = strtod(field_values[i], NULL);
            continue;
        }

        if (strcmp(field_names[i], "min_width") == 0) {
            record->min_width = strtod(field_values[i], NULL);
            continue;
        }

        if (strcmp(field_names[i], "signposted_as") == 0) {
            strcpy(record->signposted_as, field_values[i]);
            continue;
        }

        if (strcmp(field_names[i], "reversed_signposted_as") == 0) {
            strcpy(record->reversed_signposted_as, field_values[i]);
            continue;
        }
    }
}